

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric_input.cpp
# Opt level: O0

void Omega_h::add_implied_isos_tag(Mesh *mesh)

{
  Mesh *mesh_00;
  char *file;
  allocator local_f1;
  string local_f0 [32];
  Read<double> local_d0;
  undefined1 local_c0 [8];
  Reals metrics;
  allocator local_79;
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [39];
  ScopedTimer local_11;
  Mesh *pMStack_10;
  ScopedTimer omega_h_scoped_function_timer;
  Mesh *mesh_local;
  
  pMStack_10 = mesh;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric_input.cpp"
             ,&local_79);
  std::operator+(local_58,(char *)local_78);
  std::__cxx11::to_string((__cxx11 *)&metrics.write_.shared_alloc_.direct_ptr,0x115);
  std::operator+(local_38,local_58);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_11,"add_implied_isos_tag",file);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)&metrics.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  get_implied_isos((Omega_h *)local_c0,pMStack_10);
  mesh_00 = pMStack_10;
  Read<double>::Read(&local_d0,(Read<double> *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"metric",&local_f1);
  add_metric_tag(mesh_00,&local_d0,(string *)local_f0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  Read<double>::~Read(&local_d0);
  Read<double>::~Read((Read<double> *)local_c0);
  ScopedTimer::~ScopedTimer(&local_11);
  return;
}

Assistant:

void add_implied_isos_tag(Mesh* mesh) {
  OMEGA_H_TIME_FUNCTION;
  auto metrics = get_implied_isos(mesh);
  add_metric_tag(mesh, metrics, "metric");
}